

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  _Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *p_Var1;
  ITracker *pIVar2;
  bool bVar3;
  TrackerContext *pTVar4;
  long lVar5;
  undefined4 in_register_00000034;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __it;
  long lVar6;
  _Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *this_00;
  _Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *p_Var7;
  ReusableStringStream local_70;
  string local_60;
  SourceLineInfo local_40;
  
  __it._M_current =
       (unique_ptr<Catch::TestCaseTracking::ITracker> *)CONCAT44(in_register_00000034,__fd);
  pTVar4 = this->m_ctx;
  while ((TrackerBase *)pTVar4->m_currentTracker != this) {
    (*(((TrackerBase *)pTVar4->m_currentTracker)->super_ITracker)._vptr_ITracker[3])();
    pTVar4 = this->m_ctx;
  }
  switch((this->super_ITracker).m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    ReusableStringStream::ReusableStringStream(&local_70);
    local_40.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_40.line = 0x18fc;
    operator<<(local_70.m_oss,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_70.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_70.m_oss,"Illogical state: ",0x11);
    std::ostream::operator<<(local_70.m_oss,(this->super_ITracker).m_runState);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_60);
  case Executing:
    goto switchD_001594ff_caseD_1;
  case ExecutingChildren:
    this_00 = (_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *)
              (this->super_ITracker).m_children.
              super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    p_Var1 = (_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::__0> *)
             (this->super_ITracker).m_children.
             super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)p_Var1 - (long)this_00;
    if (0 < lVar6 >> 5) {
      lVar5 = (lVar6 >> 5) + 1;
      do {
        bVar3 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
                operator()(this_00,__it);
        p_Var7 = this_00;
        if (bVar3) goto LAB_001595b6;
        bVar3 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
                operator()(this_00 + 8,__it);
        p_Var7 = this_00 + 8;
        if (bVar3) goto LAB_001595b6;
        bVar3 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
                operator()(this_00 + 0x10,__it);
        p_Var7 = this_00 + 0x10;
        if (bVar3) goto LAB_001595b6;
        bVar3 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
                operator()(this_00 + 0x18,__it);
        p_Var7 = this_00 + 0x18;
        if (bVar3) goto LAB_001595b6;
        this_00 = this_00 + 0x20;
        lVar5 = lVar5 + -1;
        lVar6 = lVar6 + -0x20;
      } while (1 < lVar5);
    }
    lVar6 = lVar6 >> 3;
    if (lVar6 == 1) {
LAB_001595a5:
      bVar3 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00,__it);
      p_Var7 = this_00;
      if (!bVar3) {
        p_Var7 = p_Var1;
      }
    }
    else if (lVar6 == 2) {
LAB_00159595:
      bVar3 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00,__it);
      p_Var7 = this_00;
      if (!bVar3) {
        this_00 = this_00 + 8;
        goto LAB_001595a5;
      }
    }
    else {
      if (lVar6 != 3) goto switchD_001594ff_caseD_1;
      bVar3 = __gnu_cxx::__ops::_Iter_negate<Catch::TestCaseTracking::TrackerBase::close()::$_0>::
              operator()(this_00,__it);
      p_Var7 = this_00;
      if (!bVar3) {
        this_00 = this_00 + 8;
        goto LAB_00159595;
      }
    }
LAB_001595b6:
    if (p_Var7 != p_Var1) goto switchD_001594ff_caseD_3;
switchD_001594ff_caseD_1:
    (this->super_ITracker).m_runState = CompletedSuccessfully;
switchD_001594ff_caseD_3:
    pIVar2 = (this->super_ITracker).m_parent;
    if (pIVar2 == (ITracker *)0x0) {
      __assert_fail("m_parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                    ,0x190d,"void Catch::TestCaseTracking::TrackerBase::moveToParent()");
    }
    pTVar4 = this->m_ctx;
    pTVar4->m_currentTracker = pIVar2;
    pTVar4->m_runState = CompletedCycle;
    return (int)pIVar2;
  case NeedsAnotherRun:
    goto switchD_001594ff_caseD_3;
  default:
    ReusableStringStream::ReusableStringStream(&local_70);
    local_40.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_40.line = 0x18ff;
    operator<<(local_70.m_oss,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_70.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_70.m_oss,"Unknown state: ",0xf);
    std::ostream::operator<<(local_70.m_oss,(this->super_ITracker).m_runState);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_60);
  }
}

Assistant:

void TrackerBase::close() {

        // Close any still open children (e.g. generators)
        while( &m_ctx.currentTracker() != this )
            m_ctx.currentTracker().close();

        switch( m_runState ) {
            case NeedsAnotherRun:
                break;

            case Executing:
                m_runState = CompletedSuccessfully;
                break;
            case ExecutingChildren:
                if( std::all_of(m_children.begin(), m_children.end(), [](ITrackerPtr const& t){ return t->isComplete(); }) )
                    m_runState = CompletedSuccessfully;
                break;

            case NotStarted:
            case CompletedSuccessfully:
            case Failed:
                CATCH_INTERNAL_ERROR( "Illogical state: " << m_runState );

            default:
                CATCH_INTERNAL_ERROR( "Unknown state: " << m_runState );
        }
        moveToParent();
        m_ctx.completeCycle();
    }